

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void resolveP2Values(Vdbe *p,int *pMaxFuncArgs)

{
  Parse *pPVar1;
  int *piVar2;
  Op *pOVar3;
  int iVar4;
  
  iVar4 = *pMaxFuncArgs;
  pPVar1 = p->pParse;
  piVar2 = pPVar1->aLabel;
  *(ushort *)&p->field_0xc5 = *(ushort *)&p->field_0xc5 & 0xfcff | 0x100;
  pOVar3 = p->aOp + p->nOp;
  do {
    if (0x3d < pOVar3[-1].opcode) goto LAB_0016c0ae;
    switch(pOVar3[-1].opcode) {
    case '\x02':
      if (pOVar3[-1].p2 != 0) {
        p->field_0xc6 = p->field_0xc6 & 0xfe;
      }
    case '\0':
    case '\x01':
      p->field_0xc6 = p->field_0xc6 | 2;
      break;
    case '\x03':
    case '\x05':
      pOVar3[-1].p4.p = sqlite3BtreeNext;
      goto LAB_0016c0aa;
    case '\x04':
      pOVar3[-1].p4.p = sqlite3BtreePrevious;
LAB_0016c0aa:
      pOVar3[-1].p4type = -5;
      break;
    case '\x06':
    case '\a':
    case '\b':
      *(ushort *)&p->field_0xc5 = *(ushort *)&p->field_0xc5 & 0xfcff | 0x200;
      break;
    case '\t':
      if (iVar4 < pOVar3[-2].p1) {
        iVar4 = pOVar3[-2].p1;
      }
    default:
      if (pOVar3[-1].p2 < 0) {
        pOVar3[-1].p2 = piVar2[(uint)~pOVar3[-1].p2];
      }
      break;
    case '\n':
      if (iVar4 < pOVar3[-1].p2) {
        iVar4 = pOVar3[-1].p2;
      }
    }
LAB_0016c0ae:
    pOVar3 = pOVar3 + -1;
    if (pOVar3 == p->aOp) {
      if (pPVar1->aLabel != (int *)0x0) {
        sqlite3DbFreeNN(p->db,pPVar1->aLabel);
      }
      pPVar1->aLabel = (int *)0x0;
      pPVar1->nLabel = 0;
      *pMaxFuncArgs = iVar4;
      return;
    }
  } while( true );
}

Assistant:

static void resolveP2Values(Vdbe *p, int *pMaxFuncArgs){
  int nMaxArgs = *pMaxFuncArgs;
  Op *pOp;
  Parse *pParse = p->pParse;
  int *aLabel = pParse->aLabel;
  p->readOnly = 1;
  p->bIsReader = 0;
  pOp = &p->aOp[p->nOp-1];
  while(1){

    /* Only JUMP opcodes and the short list of special opcodes in the switch
    ** below need to be considered.  The mkopcodeh.tcl generator script groups
    ** all these opcodes together near the front of the opcode list.  Skip
    ** any opcode that does not need processing by virtual of the fact that
    ** it is larger than SQLITE_MX_JUMP_OPCODE, as a performance optimization.
    */
    if( pOp->opcode<=SQLITE_MX_JUMP_OPCODE ){
      /* NOTE: Be sure to update mkopcodeh.tcl when adding or removing
      ** cases from this switch! */
      switch( pOp->opcode ){
        case OP_Transaction: {
          if( pOp->p2!=0 ) p->readOnly = 0;
          /* fall thru */
        }
        case OP_AutoCommit:
        case OP_Savepoint: {
          p->bIsReader = 1;
          break;
        }
#ifndef SQLITE_OMIT_WAL
        case OP_Checkpoint:
#endif
        case OP_Vacuum:
        case OP_JournalMode: {
          p->readOnly = 0;
          p->bIsReader = 1;
          break;
        }
        case OP_Next:
        case OP_SorterNext: {
          pOp->p4.xAdvance = sqlite3BtreeNext;
          pOp->p4type = P4_ADVANCE;
          /* The code generator never codes any of these opcodes as a jump
          ** to a label.  They are always coded as a jump backwards to a 
          ** known address */
          assert( pOp->p2>=0 );
          break;
        }
        case OP_Prev: {
          pOp->p4.xAdvance = sqlite3BtreePrevious;
          pOp->p4type = P4_ADVANCE;
          /* The code generator never codes any of these opcodes as a jump
          ** to a label.  They are always coded as a jump backwards to a 
          ** known address */
          assert( pOp->p2>=0 );
          break;
        }
#ifndef SQLITE_OMIT_VIRTUALTABLE
        case OP_VUpdate: {
          if( pOp->p2>nMaxArgs ) nMaxArgs = pOp->p2;
          break;
        }
        case OP_VFilter: {
          int n;
          assert( (pOp - p->aOp) >= 3 );
          assert( pOp[-1].opcode==OP_Integer );
          n = pOp[-1].p1;
          if( n>nMaxArgs ) nMaxArgs = n;
          /* Fall through into the default case */
        }
#endif
        default: {
          if( pOp->p2<0 ){
            /* The mkopcodeh.tcl script has so arranged things that the only
            ** non-jump opcodes less than SQLITE_MX_JUMP_CODE are guaranteed to
            ** have non-negative values for P2. */
            assert( (sqlite3OpcodeProperty[pOp->opcode] & OPFLG_JUMP)!=0 );
            assert( ADDR(pOp->p2)<-pParse->nLabel );
            pOp->p2 = aLabel[ADDR(pOp->p2)];
          }
          break;
        }
      }
      /* The mkopcodeh.tcl script has so arranged things that the only
      ** non-jump opcodes less than SQLITE_MX_JUMP_CODE are guaranteed to
      ** have non-negative values for P2. */
      assert( (sqlite3OpcodeProperty[pOp->opcode]&OPFLG_JUMP)==0 || pOp->p2>=0);
    }
    if( pOp==p->aOp ) break;
    pOp--;
  }
  sqlite3DbFree(p->db, pParse->aLabel);
  pParse->aLabel = 0;
  pParse->nLabel = 0;
  *pMaxFuncArgs = nMaxArgs;
  assert( p->bIsReader!=0 || DbMaskAllZero(p->btreeMask) );
}